

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpEdgeIndicatorSyntax::setChild
          (UdpEdgeIndicatorSyntax *this,size_t index,TokenOrSyntax child)

{
  logic_error *this_00;
  Token TVar1;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  UdpEdgeIndicatorSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar1._0_8_;
    (this->openParen).kind = (undefined2)local_28;
    (this->openParen).field_0x2 = local_28._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->openParen).rawLen = local_28._4_4_;
    local_20 = TVar1.info;
    (this->openParen).info = local_20;
    break;
  case 1:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar1._0_8_;
    (this->first).kind = (undefined2)local_38;
    (this->first).field_0x2 = local_38._2_1_;
    (this->first).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->first).rawLen = local_38._4_4_;
    local_30 = TVar1.info;
    (this->first).info = local_30;
    break;
  case 2:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar1._0_8_;
    (this->second).kind = (undefined2)local_48;
    (this->second).field_0x2 = local_48._2_1_;
    (this->second).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->second).rawLen = local_48._4_4_;
    local_40 = TVar1.info;
    (this->second).info = local_40;
    break;
  case 3:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar1._0_8_;
    (this->closeParen).kind = (undefined2)local_58;
    (this->closeParen).field_0x2 = local_58._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->closeParen).rawLen = local_58._4_4_;
    local_50 = TVar1.info;
    (this->closeParen).info = local_50;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0x33a5);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void UdpEdgeIndicatorSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: first = child.token(); return;
        case 2: second = child.token(); return;
        case 3: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}